

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  bool bVar1;
  int in_ECX;
  IdxElement *in_RDX;
  int in_ESI;
  undefined1 in_R8B;
  int mid;
  int hi;
  int lo;
  IdxElement tmp;
  IdxElement pivotkey;
  IdxElement *in_stack_fffffffffffff518;
  IdxElement *in_stack_fffffffffffff520;
  IdxElement *pIVar2;
  undefined7 in_stack_fffffffffffff528;
  undefined1 in_stack_fffffffffffff52f;
  undefined7 in_stack_fffffffffffff538;
  undefined1 in_stack_fffffffffffff53f;
  IdxElement *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  undefined1 uVar3;
  undefined1 local_aa1;
  undefined1 local_a91;
  undefined1 local_a81;
  int in_stack_fffffffffffff74c;
  IdxCompare *in_stack_fffffffffffff750;
  int in_stack_fffffffffffff75c;
  IdxElement *in_stack_fffffffffffff760;
  undefined4 local_130;
  undefined4 local_12c;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar4;
  int iVar5;
  int end_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    local_130 = in_ESI + -1;
    local_12c = in_ECX;
    while (uVar4 = uVar4 & 0x1ffffff, 0x18 < local_130 - local_12c) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(in_stack_fffffffffffff518);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(in_stack_fffffffffffff518);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
      iVar5 = local_12c;
      iVar6 = local_130;
      while( true ) {
        pIVar2 = in_RDX;
        if ((uVar4 & 0x1000000) == 0) {
          while( true ) {
            local_aa1 = false;
            if (local_12c < iVar6) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548)
                         ,in_stack_fffffffffffff540,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538)
                        );
              local_aa1 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528
                                                ),&in_stack_fffffffffffff520->idx);
            }
            if (local_aa1 == false) break;
            local_12c = local_12c + 1;
          }
          while( true ) {
            uVar3 = false;
            in_RDX = pIVar2;
            if (iVar5 < local_130) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)CONCAT17(uVar3,in_stack_fffffffffffff548),pIVar2,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538)
                        );
              uVar3 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528),
                                 &in_stack_fffffffffffff520->idx);
              in_stack_fffffffffffff540 = pIVar2;
            }
            if ((type_conflict5)uVar3 == false) break;
            local_130 = local_130 + -1;
            pIVar2 = in_RDX;
          }
          in_stack_fffffffffffff54f = 0;
        }
        else {
          while( true ) {
            local_a81 = false;
            if (local_12c < iVar6) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548)
                         ,in_stack_fffffffffffff540,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538)
                        );
              local_a81 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528
                                                ),&in_stack_fffffffffffff520->idx);
            }
            if (local_a81 == false) break;
            local_12c = local_12c + 1;
          }
          while( true ) {
            local_a91 = false;
            if (iVar5 < local_130) {
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((IdxCompare *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548)
                         ,in_stack_fffffffffffff540,
                         (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538)
                        );
              local_a91 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528
                                                ),&in_stack_fffffffffffff520->idx);
            }
            if (local_a91 == false) break;
            local_130 = local_130 + -1;
          }
        }
        if (local_130 <= local_12c) break;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
        local_12c = local_12c + 1;
        local_130 = local_130 + -1;
      }
      pIVar2 = in_RDX;
      if ((uVar4 & 0x1000000) == 0) {
        while( true ) {
          in_stack_fffffffffffff52f = false;
          in_RDX = pIVar2;
          if (iVar5 < local_130) {
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement(pIVar2,in_stack_fffffffffffff518);
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement(pIVar2,in_stack_fffffffffffff518);
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((IdxCompare *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
                       in_stack_fffffffffffff540,
                       (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
            in_stack_fffffffffffff52f =
                 boost::multiprecision::operator<=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528),
                            &pIVar2->idx);
            in_stack_fffffffffffff520 = pIVar2;
          }
          if ((type_conflict5)in_stack_fffffffffffff52f == false) break;
          local_130 = local_130 + -1;
          pIVar2 = in_RDX;
        }
        if (local_130 == iVar6) {
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          local_130 = local_130 + -1;
        }
      }
      else {
        while( true ) {
          in_stack_fffffffffffff53f = false;
          if (local_12c < iVar6) {
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxElement::IdxElement(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((IdxCompare *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
                       in_stack_fffffffffffff540,
                       (IdxElement *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538));
            in_stack_fffffffffffff53f =
                 boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528),
                            &in_stack_fffffffffffff520->idx);
          }
          if ((type_conflict5)in_stack_fffffffffffff53f == false) break;
          local_12c = local_12c + 1;
        }
        if (local_12c == iVar5) {
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxElement::operator=(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          local_12c = local_12c + 1;
        }
      }
      end_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar6 - local_12c < local_130 - iVar5) {
        bVar1 = local_12c < iVar6;
        local_12c = iVar5;
        if (bVar1) {
          SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((IdxElement *)CONCAT44(iVar6,in_stack_fffffffffffffff0),end_00,
                     (IdxCompare *)CONCAT44(iVar5,uVar4),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_12c = iVar5;
        }
      }
      else {
        bVar1 = iVar5 < local_130;
        local_130 = iVar6;
        if (bVar1) {
          SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((IdxElement *)CONCAT44(iVar6,in_stack_fffffffffffffff0),end_00,
                     (IdxCompare *)CONCAT44(iVar5,uVar4),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_130 = iVar6;
        }
      }
      uVar4 = uVar4 ^ 0xff000000;
    }
    if (0 < local_130 - local_12c) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (in_stack_fffffffffffff760,in_stack_fffffffffffff75c,in_stack_fffffffffffff750,
                 in_stack_fffffffffffff74c);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}